

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase237::run(TestCase237 *this)

{
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  Reader brand_02;
  bool bVar1;
  Schema *pSVar2;
  uint64_t uVar3;
  bool local_261;
  Schema SStack_260;
  bool _kj_shouldLog_2;
  Reader local_258;
  Schema local_220;
  Schema *local_218;
  undefined1 local_210 [8];
  DebugComparison<capnp::Schema_&,_capnp::Schema> _kjCondition_3;
  Schema SStack_1e0;
  bool _kj_shouldLog_1;
  Reader local_1d8;
  Schema local_1a0;
  Schema *local_198;
  undefined1 local_190 [8];
  DebugComparison<capnp::Schema_&,_capnp::Schema> _kjCondition_2;
  Schema SStack_160;
  bool _kj_shouldLog;
  Reader local_158;
  Schema local_128;
  Schema *local_120;
  undefined1 local_118 [8];
  DebugComparison<capnp::Schema_&,_capnp::Schema> _kjCondition_1;
  Reader local_e8;
  Schema local_b8;
  size_t local_b0;
  uint local_a4;
  Fault local_a0;
  Fault f;
  uint local_90;
  DebugExpression<unsigned_int> local_8c;
  undefined1 local_88 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Array<capnp::Schema> list;
  undefined1 local_38 [8];
  SchemaLoader loader;
  TestCase237 *this_local;
  
  loader.impl.value.ptr = (Impl *)this;
  SchemaLoader::SchemaLoader((SchemaLoader *)local_38);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestAllTypes>
            ((SchemaLoader *)local_38);
  SchemaLoader::getAllLoaded((Array<capnp::Schema> *)&_kjCondition.result,(SchemaLoader *)local_38);
  local_90 = 2;
  local_8c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
  f.exception = (Exception *)
                kj::Array<capnp::Schema>::size((Array<capnp::Schema> *)&_kjCondition.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_88,&local_8c,(unsigned_long *)&f)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (bVar1) {
    pSVar2 = kj::Array<capnp::Schema>::operator[]((Array<capnp::Schema> *)&_kjCondition.result,0);
    uVar3 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                      ();
    local_e8._reader.dataSize = 0;
    local_e8._reader.pointerCount = 0;
    local_e8._reader._38_2_ = 0;
    local_e8._reader.nestingLimit = 0;
    local_e8._reader._44_4_ = 0;
    local_e8._reader.data = (void *)0x0;
    local_e8._reader.pointers = (WirePointer *)0x0;
    local_e8._reader.segment = (SegmentReader *)0x0;
    local_e8._reader.capTable = (CapTableReader *)0x0;
    capnp::schema::Brand::Reader::Reader(&local_e8);
    Schema::Schema((Schema *)&_kjCondition_1.result);
    brand._reader.capTable = local_e8._reader.capTable;
    brand._reader.segment = local_e8._reader.segment;
    brand._reader.data = local_e8._reader.data;
    brand._reader.pointers = local_e8._reader.pointers;
    brand._reader.dataSize = local_e8._reader.dataSize;
    brand._reader.pointerCount = local_e8._reader.pointerCount;
    brand._reader._38_2_ = local_e8._reader._38_2_;
    brand._reader.nestingLimit = local_e8._reader.nestingLimit;
    brand._reader._44_4_ = local_e8._reader._44_4_;
    local_b8 = SchemaLoader::get((SchemaLoader *)local_38,uVar3,brand,(Schema)_kjCondition_1._32_8_)
    ;
    bVar1 = Schema::operator==(pSVar2,&local_b8);
    if (bVar1) {
      pSVar2 = kj::Array<capnp::Schema>::operator[]((Array<capnp::Schema> *)&_kjCondition.result,1);
      local_120 = (Schema *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pSVar2);
      uVar3 = typeId<capnp::schemas::TestEnum_9c8e9318b29d9cd3,11281115850894843091ul>();
      local_158._reader.dataSize = 0;
      local_158._reader.pointerCount = 0;
      local_158._reader._38_2_ = 0;
      local_158._reader.nestingLimit = 0;
      local_158._reader._44_4_ = 0;
      local_158._reader.data = (void *)0x0;
      local_158._reader.pointers = (WirePointer *)0x0;
      local_158._reader.segment = (SegmentReader *)0x0;
      local_158._reader.capTable = (CapTableReader *)0x0;
      capnp::schema::Brand::Reader::Reader(&local_158);
      Schema::Schema(&stack0xfffffffffffffea0);
      brand_00._reader.capTable = local_158._reader.capTable;
      brand_00._reader.segment = local_158._reader.segment;
      brand_00._reader.data = local_158._reader.data;
      brand_00._reader.pointers = local_158._reader.pointers;
      brand_00._reader.dataSize = local_158._reader.dataSize;
      brand_00._reader.pointerCount = local_158._reader.pointerCount;
      brand_00._reader._38_2_ = local_158._reader._38_2_;
      brand_00._reader.nestingLimit = local_158._reader.nestingLimit;
      brand_00._reader._44_4_ = local_158._reader._44_4_;
      local_128 = SchemaLoader::get((SchemaLoader *)local_38,uVar3,brand_00,SStack_160);
      kj::_::DebugExpression<capnp::Schema&>::operator==
                ((DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_118,
                 (DebugExpression<capnp::Schema&> *)&local_120,&local_128);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
      if (!bVar1) {
        _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_2._39_1_ != '\0') {
          kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                     ,0xf4,ERROR,
                     "\"failed: expected \" \"list[1] == loader.get(typeId<TestEnum>())\", _kjCondition"
                     ,(char (*) [59])"failed: expected list[1] == loader.get(typeId<TestEnum>())",
                     (DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_118);
          _kjCondition_2._39_1_ = 0;
        }
      }
    }
    else {
      pSVar2 = kj::Array<capnp::Schema>::operator[]((Array<capnp::Schema> *)&_kjCondition.result,0);
      local_198 = (Schema *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pSVar2);
      uVar3 = typeId<capnp::schemas::TestEnum_9c8e9318b29d9cd3,11281115850894843091ul>();
      local_1d8._reader.dataSize = 0;
      local_1d8._reader.pointerCount = 0;
      local_1d8._reader._38_2_ = 0;
      local_1d8._reader.nestingLimit = 0;
      local_1d8._reader._44_4_ = 0;
      local_1d8._reader.data = (void *)0x0;
      local_1d8._reader.pointers = (WirePointer *)0x0;
      local_1d8._reader.segment = (SegmentReader *)0x0;
      local_1d8._reader.capTable = (CapTableReader *)0x0;
      capnp::schema::Brand::Reader::Reader(&local_1d8);
      Schema::Schema(&stack0xfffffffffffffe20);
      brand_01._reader.capTable = local_1d8._reader.capTable;
      brand_01._reader.segment = local_1d8._reader.segment;
      brand_01._reader.data = local_1d8._reader.data;
      brand_01._reader.pointers = local_1d8._reader.pointers;
      brand_01._reader.dataSize = local_1d8._reader.dataSize;
      brand_01._reader.pointerCount = local_1d8._reader.pointerCount;
      brand_01._reader._38_2_ = local_1d8._reader._38_2_;
      brand_01._reader.nestingLimit = local_1d8._reader.nestingLimit;
      brand_01._reader._44_4_ = local_1d8._reader._44_4_;
      local_1a0 = SchemaLoader::get((SchemaLoader *)local_38,uVar3,brand_01,SStack_1e0);
      kj::_::DebugExpression<capnp::Schema&>::operator==
                ((DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_190,
                 (DebugExpression<capnp::Schema&> *)&local_198,&local_1a0);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
      if (!bVar1) {
        _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_3._39_1_ != '\0') {
          kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                     ,0xf6,ERROR,
                     "\"failed: expected \" \"list[0] == loader.get(typeId<TestEnum>())\", _kjCondition"
                     ,(char (*) [59])"failed: expected list[0] == loader.get(typeId<TestEnum>())",
                     (DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_190);
          _kjCondition_3._39_1_ = 0;
        }
      }
      pSVar2 = kj::Array<capnp::Schema>::operator[]((Array<capnp::Schema> *)&_kjCondition.result,1);
      local_218 = (Schema *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pSVar2);
      uVar3 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                        ();
      local_258._reader.dataSize = 0;
      local_258._reader.pointerCount = 0;
      local_258._reader._38_2_ = 0;
      local_258._reader.nestingLimit = 0;
      local_258._reader._44_4_ = 0;
      local_258._reader.data = (void *)0x0;
      local_258._reader.pointers = (WirePointer *)0x0;
      local_258._reader.segment = (SegmentReader *)0x0;
      local_258._reader.capTable = (CapTableReader *)0x0;
      capnp::schema::Brand::Reader::Reader(&local_258);
      Schema::Schema(&stack0xfffffffffffffda0);
      brand_02._reader.capTable = local_258._reader.capTable;
      brand_02._reader.segment = local_258._reader.segment;
      brand_02._reader.data = local_258._reader.data;
      brand_02._reader.pointers = local_258._reader.pointers;
      brand_02._reader.dataSize = local_258._reader.dataSize;
      brand_02._reader.pointerCount = local_258._reader.pointerCount;
      brand_02._reader._38_2_ = local_258._reader._38_2_;
      brand_02._reader.nestingLimit = local_258._reader.nestingLimit;
      brand_02._reader._44_4_ = local_258._reader._44_4_;
      local_220 = SchemaLoader::get((SchemaLoader *)local_38,uVar3,brand_02,SStack_260);
      kj::_::DebugExpression<capnp::Schema&>::operator==
                ((DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_210,
                 (DebugExpression<capnp::Schema&> *)&local_218,&local_220);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_210);
      if (!bVar1) {
        local_261 = kj::_::Debug::shouldLog(ERROR);
        while (local_261 != false) {
          kj::_::Debug::log<char_const(&)[63],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                     ,0xf7,ERROR,
                     "\"failed: expected \" \"list[1] == loader.get(typeId<TestAllTypes>())\", _kjCondition"
                     ,(char (*) [63])
                      "failed: expected list[1] == loader.get(typeId<TestAllTypes>())",
                     (DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_210);
          local_261 = false;
        }
      }
    }
    kj::Array<capnp::Schema>::~Array((Array<capnp::Schema> *)&_kjCondition.result);
    SchemaLoader::~SchemaLoader((SchemaLoader *)local_38);
    return;
  }
  local_a4 = 2;
  local_b0 = kj::Array<capnp::Schema>::size((Array<capnp::Schema> *)&_kjCondition.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
             ,0xf2,FAILED,"(2u) == (list.size())","_kjCondition,2u, list.size()",
             (DebugComparison<unsigned_int,_unsigned_long> *)local_88,&local_a4,&local_b0);
  kj::_::Debug::Fault::fatal(&local_a0);
}

Assistant:

TEST(SchemaLoader, Enumerate) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<TestAllTypes>();
  auto list = loader.getAllLoaded();

  ASSERT_EQ(2u, list.size());
  if (list[0] == loader.get(typeId<TestAllTypes>())) {
    EXPECT_TRUE(list[1] == loader.get(typeId<TestEnum>()));
  } else {
    EXPECT_TRUE(list[0] == loader.get(typeId<TestEnum>()));
    EXPECT_TRUE(list[1] == loader.get(typeId<TestAllTypes>()));
  }
}